

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.h
# Opt level: O2

shared_ptr<polyscope::render::TextureBuffer>
polyscope::render::
generateTextureBuffer<std::array<glm::vec<3,float,(glm::qualifier)0>,3ul>,(polyscope::DeviceBufferType)3>
          (Engine *engine)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<polyscope::render::TextureBuffer> sVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"bad call",&local_31);
  exception(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  engine->_vptr_Engine = (_func_int **)0x0;
  (engine->groundPlane).groundPlaneProgram.
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)engine;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> generateTextureBuffer(Engine* engine) {
  exception("bad call"); // default implementation, should be specialized to use
  return nullptr;
}